

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_value_numbering.cpp
# Opt level: O0

void __thiscall
mocker::GlobalValueNumbering::doValueNumbering
          (GlobalValueNumbering *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *bbLabel
          ,ValueNumberTable *valueNumber,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
          *param_4)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared_ptr<mocker::ir::Addr> *this_00;
  value_type_conflict vVar2;
  bool bVar3;
  InstList *pIVar4;
  reference psVar5;
  element_type *peVar6;
  shared_ptr<mocker::ir::Reg> *psVar7;
  shared_ptr<mocker::ir::Reg> *psVar8;
  mapped_type *pmVar9;
  reference puVar10;
  BasicBlock *this_01;
  LabelSet *this_02;
  reference pvVar11;
  bool local_431;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
  local_398;
  ValueNumberTable local_358;
  value_type_conflict local_320;
  value_type_conflict c;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  LabelSet *__range1_1;
  undefined1 local_2f0 [8];
  shared_ptr<mocker::ir::Phi> phi_1;
  shared_ptr<mocker::ir::IRInst> *inst_2;
  iterator __end2_1;
  iterator __begin2_1;
  InstList *__range2_1;
  BasicBlock *sucBB;
  unsigned_long sucLabel;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  anon_class_16_2_9bba2f6f adjustPhi;
  shared_ptr<mocker::ir::Deleted> local_250;
  shared_ptr<mocker::ir::Addr> local_240;
  undefined1 local_230 [8];
  mapped_type res;
  Key key_1;
  shared_ptr<mocker::ir::RelationInst> local_1f0;
  shared_ptr<mocker::ir::Addr> local_1e0;
  byte local_1c9;
  shared_ptr<mocker::ir::Call> local_1c8;
  byte local_1b1;
  shared_ptr<mocker::ir::Malloc> local_1b0;
  byte local_199;
  shared_ptr<mocker::ir::Alloca> local_198;
  shared_ptr<mocker::ir::Load> local_188;
  undefined1 local_178 [8];
  shared_ptr<mocker::ir::Reg> dest;
  undefined1 local_158 [24];
  shared_ptr<mocker::ir::Addr> *operand;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  *__range2;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  newOperands;
  shared_ptr<mocker::ir::IRInst> *inst_1;
  iterator End;
  shared_ptr<mocker::ir::Deleted> local_f0;
  shared_ptr<mocker::ir::Addr> local_e0;
  undefined1 local_d0 [8];
  Key key;
  undefined1 local_a0 [8];
  shared_ptr<mocker::ir::Addr> val;
  int local_6c;
  undefined1 local_68 [8];
  shared_ptr<mocker::ir::Phi> phi;
  shared_ptr<mocker::ir::IRInst> *inst;
  iterator iter;
  BasicBlock *bb;
  ExprRegMap *exprReg_local;
  ValueNumberTable *valueNumber_local;
  size_t bbLabel_local;
  GlobalValueNumbering *this_local;
  
  iter._M_node = (_List_node_base *)
                 ir::FunctionModule::getMutableBasicBlock
                           ((this->super_FuncPass).func,(size_t)bbLabel);
  pIVar4 = ir::BasicBlock::getMutableInsts_abi_cxx11_((BasicBlock *)iter._M_node);
  inst = (shared_ptr<mocker::ir::IRInst> *)
         std::__cxx11::
         list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
         ::begin(pIVar4);
  do {
    psVar5 = std::_List_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*
                       ((_List_iterator<std::shared_ptr<mocker::ir::IRInst>_> *)&inst);
    ir::dyc<mocker::ir::Deleted,std::shared_ptr<mocker::ir::IRInst>&>
              ((ir *)&phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,psVar5);
    bVar3 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    std::shared_ptr<mocker::ir::Deleted>::~shared_ptr
              ((shared_ptr<mocker::ir::Deleted> *)
               &phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (!bVar3) {
      ir::dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>&>((ir *)local_68,psVar5);
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_68);
      if (bVar3) {
        bVar3 = canProcessPhi(this,(shared_ptr<mocker::ir::Phi> *)local_68,valueNumber);
        if (bVar3) {
          anon_unknown_9::uniquePhiValues
                    ((anon_unknown_9 *)local_a0,(shared_ptr<mocker::ir::Phi> *)local_68);
          bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_a0);
          if (bVar3) {
            peVar6 = std::
                     __shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_68);
            psVar7 = ir::Definition::getDest(&peVar6->super_Definition);
            detail::ValueNumberTable::set
                      (valueNumber,psVar7,(shared_ptr<mocker::ir::Addr> *)local_a0);
            std::make_shared<mocker::ir::Deleted>();
            std::shared_ptr<mocker::ir::IRInst>::operator=
                      (psVar5,(shared_ptr<mocker::ir::Deleted> *)((long)&key.field_2 + 8));
            std::shared_ptr<mocker::ir::Deleted>::~shared_ptr
                      ((shared_ptr<mocker::ir::Deleted> *)((long)&key.field_2 + 8));
            this->cnt = this->cnt + 1;
            local_6c = 4;
          }
          else {
            local_6c = 0;
          }
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr((shared_ptr<mocker::ir::Addr> *)local_a0);
          if (local_6c == 0) {
            detail::InstHash::operator()[abi_cxx11_
                      ((Key *)local_d0,(InstHash *)((long)&this_local + 7),psVar5);
            bVar3 = isIn<std::unordered_map<std::__cxx11::string,std::shared_ptr<mocker::ir::Reg>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ir::Reg>>>>,std::__cxx11::string>
                              (param_4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_d0);
            if (bVar3) {
              peVar6 = std::
                       __shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_68);
              psVar7 = ir::Definition::getDest(&peVar6->super_Definition);
              pmVar9 = std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
                       ::at(param_4,(key_type *)local_d0);
              std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>(&local_e0,pmVar9);
              detail::ValueNumberTable::set(valueNumber,psVar7,&local_e0);
              std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_e0);
              std::make_shared<mocker::ir::Deleted>();
              std::shared_ptr<mocker::ir::IRInst>::operator=(psVar5,&local_f0);
              std::shared_ptr<mocker::ir::Deleted>::~shared_ptr(&local_f0);
              this->cnt = this->cnt + 1;
              local_6c = 4;
            }
            else {
              peVar6 = std::
                       __shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_68);
              psVar7 = ir::Definition::getDest(&peVar6->super_Definition);
              peVar6 = std::
                       __shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_68);
              psVar8 = ir::Definition::getDest(&peVar6->super_Definition);
              std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                        ((shared_ptr<mocker::ir::Addr> *)&End,psVar8);
              detail::ValueNumberTable::set(valueNumber,psVar7,(shared_ptr<mocker::ir::Addr> *)&End)
              ;
              std::shared_ptr<mocker::ir::Addr>::~shared_ptr((shared_ptr<mocker::ir::Addr> *)&End);
              peVar6 = std::
                       __shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_68);
              psVar7 = ir::Definition::getDest(&peVar6->super_Definition);
              pmVar9 = std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
                       ::operator[](param_4,(key_type *)local_d0);
              std::shared_ptr<mocker::ir::Reg>::operator=(pmVar9,psVar7);
              local_6c = 0;
            }
            std::__cxx11::string::~string((string *)local_d0);
          }
        }
        else {
          peVar6 = std::
                   __shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_68);
          psVar7 = ir::Definition::getDest(&peVar6->super_Definition);
          peVar6 = std::
                   __shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_68);
          psVar8 = ir::Definition::getDest(&peVar6->super_Definition);
          p_Var1 = &val.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ;
          std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                    ((shared_ptr<mocker::ir::Addr> *)p_Var1,psVar8);
          detail::ValueNumberTable::set(valueNumber,psVar7,(shared_ptr<mocker::ir::Addr> *)p_Var1);
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                    ((shared_ptr<mocker::ir::Addr> *)
                     &val.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          local_6c = 4;
        }
      }
      else {
        local_6c = 2;
      }
      std::shared_ptr<mocker::ir::Phi>::~shared_ptr((shared_ptr<mocker::ir::Phi> *)local_68);
      if ((local_6c != 0) && (local_6c == 2)) {
        pIVar4 = ir::BasicBlock::getMutableInsts_abi_cxx11_((BasicBlock *)iter._M_node);
        inst_1 = (shared_ptr<mocker::ir::IRInst> *)
                 std::__cxx11::
                 list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                 ::end(pIVar4);
        while (bVar3 = std::operator!=((_Self *)&inst,(_Self *)&inst_1), bVar3) {
          newOperands.
          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)std::_List_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*
                                  ((_List_iterator<std::shared_ptr<mocker::ir::IRInst>_> *)&inst);
          ir::getOperandsUsed((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                               *)&__range2,
                              (shared_ptr<mocker::ir::IRInst> *)
                              newOperands.
                              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          __end2 = std::
                   vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                   ::begin((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                            *)&__range2);
          operand = (shared_ptr<mocker::ir::Addr> *)
                    std::
                    vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                    ::end((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                           *)&__range2);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end2,(__normal_iterator<std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
                                             *)&operand), bVar3) {
            local_158._16_8_ =
                 __gnu_cxx::
                 __normal_iterator<std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
                 ::operator*(&__end2);
            detail::ValueNumberTable::get
                      ((ValueNumberTable *)local_158,(shared_ptr<mocker::ir::Addr> *)valueNumber);
            std::shared_ptr<mocker::ir::Addr>::operator=
                      ((shared_ptr<mocker::ir::Addr> *)local_158._16_8_,
                       (shared_ptr<mocker::ir::Addr> *)local_158);
            std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                      ((shared_ptr<mocker::ir::Addr> *)local_158);
            __gnu_cxx::
            __normal_iterator<std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
            ::operator++(&__end2);
          }
          ir::copyWithReplacedOperands
                    ((ir *)&dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,
                     (shared_ptr<mocker::ir::IRInst> *)
                     newOperands.
                     super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                      *)&__range2);
          p_Var1 = &dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ;
          std::shared_ptr<mocker::ir::IRInst>::operator=
                    ((shared_ptr<mocker::ir::IRInst> *)
                     newOperands.
                     super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (shared_ptr<mocker::ir::IRInst> *)p_Var1);
          std::shared_ptr<mocker::ir::IRInst>::~shared_ptr((shared_ptr<mocker::ir::IRInst> *)p_Var1)
          ;
          ir::getDest((ir *)local_178,
                      (shared_ptr<mocker::ir::IRInst> *)
                      newOperands.
                      super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_178);
          if (bVar3) {
            local_199 = 0;
            local_1b1 = 0;
            local_1c9 = 0;
            ir::dyc<mocker::ir::Load,std::shared_ptr<mocker::ir::IRInst>&>
                      ((ir *)&local_188,
                       (shared_ptr<mocker::ir::IRInst> *)
                       newOperands.
                       super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_188);
            local_431 = true;
            if (!bVar3) {
              ir::dyc<mocker::ir::Alloca,std::shared_ptr<mocker::ir::IRInst>&>
                        ((ir *)&local_198,
                         (shared_ptr<mocker::ir::IRInst> *)
                         newOperands.
                         super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_199 = 1;
              bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_198);
              local_431 = true;
              if (!bVar3) {
                ir::dyc<mocker::ir::Malloc,std::shared_ptr<mocker::ir::IRInst>&>
                          ((ir *)&local_1b0,
                           (shared_ptr<mocker::ir::IRInst> *)
                           newOperands.
                           super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                local_1b1 = 1;
                bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_1b0);
                local_431 = true;
                if (!bVar3) {
                  ir::dyc<mocker::ir::Call,std::shared_ptr<mocker::ir::IRInst>&>
                            ((ir *)&local_1c8,
                             (shared_ptr<mocker::ir::IRInst> *)
                             newOperands.
                             super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  local_1c9 = 1;
                  local_431 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_1c8);
                }
              }
            }
            if ((local_1c9 & 1) != 0) {
              std::shared_ptr<mocker::ir::Call>::~shared_ptr(&local_1c8);
            }
            if ((local_1b1 & 1) != 0) {
              std::shared_ptr<mocker::ir::Malloc>::~shared_ptr(&local_1b0);
            }
            if ((local_199 & 1) != 0) {
              std::shared_ptr<mocker::ir::Alloca>::~shared_ptr(&local_198);
            }
            std::shared_ptr<mocker::ir::Load>::~shared_ptr(&local_188);
            if (local_431 == false) {
              ir::dyc<mocker::ir::RelationInst,std::shared_ptr<mocker::ir::IRInst>&>
                        ((ir *)&local_1f0,
                         (shared_ptr<mocker::ir::IRInst> *)
                         newOperands.
                         super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
              bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_1f0);
              std::shared_ptr<mocker::ir::RelationInst>::~shared_ptr(&local_1f0);
              if (bVar3) {
                this_00 = (shared_ptr<mocker::ir::Addr> *)((long)&key_1.field_2 + 8);
                std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                          (this_00,(shared_ptr<mocker::ir::Reg> *)local_178);
                detail::ValueNumberTable::set
                          (valueNumber,(shared_ptr<mocker::ir::Reg> *)local_178,this_00);
                std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                          ((shared_ptr<mocker::ir::Addr> *)((long)&key_1.field_2 + 8));
              }
              else {
                detail::InstHash::operator()[abi_cxx11_
                          ((Key *)&res.
                                   super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount,(InstHash *)((long)&this_local + 7),
                           (shared_ptr<mocker::ir::IRInst> *)
                           newOperands.
                           super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                bVar3 = isIn<std::unordered_map<std::__cxx11::string,std::shared_ptr<mocker::ir::Reg>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ir::Reg>>>>,std::__cxx11::string>
                                  (param_4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&res.
                                               super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount);
                if (bVar3) {
                  pmVar9 = std::
                           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
                           ::at(param_4,(key_type *)
                                        &res.
                                         super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount);
                  std::shared_ptr<mocker::ir::Reg>::shared_ptr
                            ((shared_ptr<mocker::ir::Reg> *)local_230,pmVar9);
                  std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                            (&local_240,(shared_ptr<mocker::ir::Reg> *)local_230);
                  detail::ValueNumberTable::set
                            (valueNumber,(shared_ptr<mocker::ir::Reg> *)local_178,&local_240);
                  std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_240);
                  std::make_shared<mocker::ir::Deleted>();
                  std::shared_ptr<mocker::ir::IRInst>::operator=
                            ((shared_ptr<mocker::ir::IRInst> *)
                             newOperands.
                             super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_250);
                  std::shared_ptr<mocker::ir::Deleted>::~shared_ptr(&local_250);
                  this->cnt = this->cnt + 1;
                  std::shared_ptr<mocker::ir::Reg>::~shared_ptr
                            ((shared_ptr<mocker::ir::Reg> *)local_230);
                }
                else {
                  std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                            ((shared_ptr<mocker::ir::Addr> *)&adjustPhi.valueNumber,
                             (shared_ptr<mocker::ir::Reg> *)local_178);
                  detail::ValueNumberTable::set
                            (valueNumber,(shared_ptr<mocker::ir::Reg> *)local_178,
                             (shared_ptr<mocker::ir::Addr> *)&adjustPhi.valueNumber);
                  std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                            ((shared_ptr<mocker::ir::Addr> *)&adjustPhi.valueNumber);
                  pmVar9 = std::
                           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
                           ::operator[](param_4,(key_type *)
                                                &res.
                                                 super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount);
                  std::shared_ptr<mocker::ir::Reg>::operator=
                            (pmVar9,(shared_ptr<mocker::ir::Reg> *)local_178);
                }
                std::__cxx11::string::~string
                          ((string *)
                           &res.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
              }
            }
            else {
              std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                        (&local_1e0,(shared_ptr<mocker::ir::Reg> *)local_178);
              detail::ValueNumberTable::set
                        (valueNumber,(shared_ptr<mocker::ir::Reg> *)local_178,&local_1e0);
              std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_1e0);
            }
          }
          std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_178);
          std::
          vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
          ::~vector((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                     *)&__range2);
          std::_List_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++
                    ((_List_iterator<std::shared_ptr<mocker::ir::IRInst>_> *)&inst);
        }
        __range1 = bbLabel;
        adjustPhi.bbLabel = (size_t)valueNumber;
        ir::BasicBlock::getSuccessors
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__begin1,
                   (BasicBlock *)iter._M_node);
        __end1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__begin1);
        sucLabel = (unsigned_long)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__begin1);
        do {
          bVar3 = __gnu_cxx::operator!=
                            (&__end1,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      *)&sucLabel);
          if (!bVar3) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__begin1);
            this_02 = DominatorTree::getChildren(&this->dominatorTree,(size_t)bbLabel);
            __end1_1 = std::
                       unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       ::begin(this_02);
            c = (value_type_conflict)
                std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::end(this_02);
            while (bVar3 = std::__detail::operator!=
                                     (&__end1_1.super__Node_iterator_base<unsigned_long,_false>,
                                      (_Node_iterator_base<unsigned_long,_false> *)&c), bVar3) {
              pvVar11 = std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator*
                                  (&__end1_1);
              vVar2 = *pvVar11;
              local_320 = vVar2;
              detail::ValueNumberTable::ValueNumberTable(&local_358,valueNumber);
              std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
              ::unordered_map(&local_398,param_4);
              doValueNumbering(this,vVar2,&local_358,&local_398);
              std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
              ::~unordered_map(&local_398);
              detail::ValueNumberTable::~ValueNumberTable(&local_358);
              std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator++(&__end1_1)
              ;
            }
            return;
          }
          puVar10 = __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&__end1);
          this_01 = ir::FunctionModule::getMutableBasicBlock((this->super_FuncPass).func,*puVar10);
          pIVar4 = ir::BasicBlock::getMutableInsts_abi_cxx11_(this_01);
          __end2_1 = std::__cxx11::
                     list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                     ::begin(pIVar4);
          inst_2 = (shared_ptr<mocker::ir::IRInst> *)
                   std::__cxx11::
                   list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                   ::end(pIVar4);
          while (bVar3 = std::operator!=(&__end2_1,(_Self *)&inst_2), bVar3) {
            psVar5 = std::_List_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*(&__end2_1)
            ;
            ir::dyc<mocker::ir::Deleted,std::shared_ptr<mocker::ir::IRInst>&>
                      ((ir *)&phi_1.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,psVar5);
            bVar3 = std::__shared_ptr::operator_cast_to_bool
                              ((__shared_ptr *)
                               &phi_1.
                                super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
            std::shared_ptr<mocker::ir::Deleted>::~shared_ptr
                      ((shared_ptr<mocker::ir::Deleted> *)
                       &phi_1.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            if (!bVar3) {
              ir::dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>&>((ir *)local_2f0,psVar5);
              bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_2f0);
              if (bVar3) {
                doValueNumbering::anon_class_16_2_9bba2f6f::operator()
                          ((anon_class_16_2_9bba2f6f *)&__range1_1,
                           (shared_ptr<mocker::ir::Phi> *)&__range1);
                std::shared_ptr<mocker::ir::IRInst>::operator=
                          (psVar5,(shared_ptr<mocker::ir::Phi> *)&__range1_1);
                std::shared_ptr<mocker::ir::Phi>::~shared_ptr
                          ((shared_ptr<mocker::ir::Phi> *)&__range1_1);
                local_6c = 0;
              }
              else {
                local_6c = 0xc;
              }
              std::shared_ptr<mocker::ir::Phi>::~shared_ptr
                        ((shared_ptr<mocker::ir::Phi> *)local_2f0);
              if (local_6c != 0) break;
            }
            std::_List_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&__end2_1);
          }
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&__end1);
        } while( true );
      }
    }
    std::_List_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++
              ((_List_iterator<std::shared_ptr<mocker::ir::IRInst>_> *)&inst);
  } while( true );
}

Assistant:

void GlobalValueNumbering::doValueNumbering(
    std::size_t bbLabel, detail::ValueNumberTable valueNumber,
    detail::InstHash instHash, ExprRegMap exprReg) {
  auto &bb = func.getMutableBasicBlock(bbLabel);

  auto iter = bb.getMutableInsts().begin();
  for (;; ++iter) {
    auto &inst = *iter;
    if (ir::dyc<ir::Deleted>(inst))
      continue;
    const auto phi = ir::dyc<ir::Phi>(inst);
    if (!phi)
      break;

    if (!canProcessPhi(phi, valueNumber)) {
      valueNumber.set(phi->getDest(), phi->getDest());
      continue;
    }

    if (auto val = uniquePhiValues(phi)) { // phi is meaningless
      valueNumber.set(phi->getDest(), val);
      inst = std::make_shared<ir::Deleted>();
      ++cnt;
      continue;
    }

    auto key = instHash(inst);
    if (isIn(exprReg, key)) { // reusable
      valueNumber.set(phi->getDest(), exprReg.at(key));
      inst = std::make_shared<ir::Deleted>();
      ++cnt;
      continue;
    }

    valueNumber.set(phi->getDest(), phi->getDest());
    exprReg[key] = phi->getDest();
  }

  for (auto End = bb.getMutableInsts().end(); iter != End; ++iter) {
    auto &inst = *iter;
    auto newOperands = ir::getOperandsUsed(inst);
    for (auto &operand : newOperands)
      operand = valueNumber.get(operand);
    inst = ir::copyWithReplacedOperands(inst, newOperands);

    auto dest = ir::getDest(inst);
    if (!dest)
      continue;
    if (ir::dyc<ir::Load>(inst) || ir::dyc<ir::Alloca>(inst) ||
        ir::dyc<ir::Malloc>(inst) || ir::dyc<ir::Call>(inst)) {
      valueNumber.set(dest, dest);
      continue;
    }
    // Do not value number relation instructions.
    // [cf. instruction_selection.cpp, genRelation]
    if (ir::dyc<ir::RelationInst>(inst)) {
      valueNumber.set(dest, dest);
      continue;
    }

    auto key = instHash(inst);
    if (isIn(exprReg, key)) {
      auto res = exprReg.at(key);
      valueNumber.set(dest, res);
      inst = std::make_shared<ir::Deleted>();
      ++cnt;
      continue;
    }
    valueNumber.set(dest, dest);
    exprReg[key] = dest;
  }

  auto adjustPhi = [bbLabel,
                    &valueNumber](const std::shared_ptr<ir::Phi> &phi) {
    std::vector<ir::Phi::Option> newOptions;
    for (auto &option : phi->getOptions()) {
      if (option.second->getID() != bbLabel) {
        newOptions.emplace_back(option);
        continue;
      }
      newOptions.emplace_back(
          std::make_pair(valueNumber.get(option.first), option.second));
    }
    return std::make_shared<ir::Phi>(phi->getDest(), std::move(newOptions));
  };
  for (auto sucLabel : bb.getSuccessors()) {
    auto &sucBB = func.getMutableBasicBlock(sucLabel);
    for (auto &inst : sucBB.getMutableInsts()) {
      if (ir::dyc<ir::Deleted>(inst))
        continue;
      auto phi = ir::dyc<ir::Phi>(inst);
      if (!phi)
        break;
      inst = adjustPhi(phi);
    }
  }

  for (auto c : dominatorTree.getChildren(bbLabel))
    doValueNumbering(c, valueNumber, instHash, exprReg);
}